

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O0

bool __thiscall Shell::TermAlgebra::emptyDomain(TermAlgebra *this)

{
  Array<Shell::TermAlgebraConstructor_*> *in_RDI;
  uint i;
  size_t in_stack_ffffffffffffffd8;
  uint local_14;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if ((int)in_RDI->_capacity == 0) {
    bVar1 = true;
  }
  else if ((in_RDI->_capacity & 0x100000000) == 0) {
    for (local_14 = 0; local_14 < (uint)in_RDI->_capacity; local_14 = local_14 + 1) {
      Lib::Array<Shell::TermAlgebraConstructor_*>::operator[](in_RDI,in_stack_ffffffffffffffd8);
      bVar1 = TermAlgebraConstructor::recursive
                        ((TermAlgebraConstructor *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TermAlgebra::emptyDomain()
{
  if (_n == 0) {
    return true;
  }

  if (_allowsCyclicTerms) {
    return false;
  }

  for (unsigned i = 0; i < _n; i++) {
    if (!(_constrs[i]->recursive())) {
      return false;
    }
  }
  return true;
}